

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int evfilt_timer_knote_modify(filter *filt,knote *kn,kevent *kev)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  int flags;
  itimerspec ts;
  itimerspec local_40;
  long local_20;
  long local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  convert_timedata_to_itimerspec
            (&local_40,*(long *)(in_RDX + 0x10),*(uint *)(in_RDX + 0xc),
             *(ushort *)(in_RDX + 10) & 0x10);
  iVar1 = timerfd_settime(*(int *)(local_18 + 0x80),(uint)((*(uint *)(local_20 + 0xc) & 8) != 0),
                          (itimerspec *)&local_40,(itimerspec *)0x0);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    *(ushort *)(local_18 + 10) = *(ushort *)(local_20 + 10) | 0x20;
    *(undefined4 *)(local_18 + 0xc) = *(undefined4 *)(local_20 + 0xc);
    *(undefined8 *)(local_18 + 0x10) = *(undefined8 *)(local_20 + 0x10);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
evfilt_timer_knote_modify(struct filter *filt, struct knote *kn,
        const struct kevent *kev)
{
    struct itimerspec ts;
    int flags;

    dbg_printf("timer_fd=%i - modified", kn->kn_timerfd);

    convert_timedata_to_itimerspec(&ts, kev->data, kev->fflags,
                                   kev->flags & EV_ONESHOT);
    flags = (kev->fflags & NOTE_ABSOLUTE) ? TFD_TIMER_ABSTIME : 0;
    if (timerfd_settime(kn->kn_timerfd, flags, &ts, NULL) < 0) {
        dbg_printf("timerfd_settime(2): %s", strerror(errno));
        return (-1);
    }

    kn->kev.flags = kev->flags | EV_CLEAR;
    kn->kev.fflags = kev->fflags;
    kn->kev.data = kev->data;

    return (0);
}